

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_list.h
# Opt level: O2

ngx_int_t ngx_list_init(ngx_list_t *list,ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  void *pvVar1;
  ngx_int_t nVar2;
  
  pvVar1 = ngx_palloc(pool,0x180);
  (list->part).elts = pvVar1;
  if (pvVar1 == (void *)0x0) {
    nVar2 = -1;
  }
  else {
    (list->part).nelts = 0;
    (list->part).next = (ngx_list_part_t *)0x0;
    list->last = &list->part;
    list->size = 0x30;
    list->nalloc = 8;
    list->pool = pool;
    nVar2 = 0;
  }
  return nVar2;
}

Assistant:

static ngx_inline ngx_int_t
ngx_list_init(ngx_list_t *list, ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    list->part.elts = ngx_palloc(pool, n * size);
    if (list->part.elts == NULL) {
        return NGX_ERROR;
    }

    list->part.nelts = 0;
    list->part.next = NULL;
    list->last = &list->part;
    list->size = size;
    list->nalloc = n;
    list->pool = pool;

    return NGX_OK;
}